

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int lj_gc_step(lua_State *L)

{
  uint32_t uVar1;
  lua_State *L_00;
  size_t sVar2;
  long in_RDI;
  int32_t ostate;
  MSize lim;
  global_State *g;
  int local_1c;
  int local_4;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 8);
  uVar1 = L_00[3].openupval.gcptr32;
  L_00[3].openupval.gcptr32 = 0xfffffffd;
  local_1c = L_00[1].glref.ptr32 * 10;
  if (local_1c == 0) {
    local_1c = 0x7fffff00;
  }
  if ((L_00->stack).ptr32 < (L_00->maxstack).ptr32) {
    L_00[1].gclist.gcptr32 = ((L_00->maxstack).ptr32 - (L_00->stack).ptr32) + L_00[1].gclist.gcptr32
    ;
  }
  do {
    sVar2 = gc_onestep(L_00);
    local_1c = local_1c - (int)sVar2;
    if (*(char *)((long)&(L_00->openupval).gcptr32 + 1) == '\0') {
      (L_00->stack).ptr32 = (*(uint *)&L_00[1].base / 100) * *(int *)((long)&L_00[1].base + 4);
      L_00[3].openupval.gcptr32 = uVar1;
      return 1;
    }
  } while (0 < local_1c);
  if (L_00[1].gclist.gcptr32 < 0x400) {
    (L_00->stack).ptr32 = (L_00->maxstack).ptr32 + 0x400;
    L_00[3].openupval.gcptr32 = uVar1;
    local_4 = -1;
  }
  else {
    L_00[1].gclist.gcptr32 = L_00[1].gclist.gcptr32 - 0x400;
    (L_00->stack).ptr32 = (L_00->maxstack).ptr32;
    L_00[3].openupval.gcptr32 = uVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int LJ_FASTCALL lj_gc_step(lua_State *L)
{
  global_State *g = G(L);
  MSize lim;
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  lim = (GCSTEPSIZE/100) * g->gc.stepmul;
  if (lim == 0)
    lim = LJ_MAX_MEM;
  if (g->gc.total > g->gc.threshold)
    g->gc.debt += g->gc.total - g->gc.threshold;
  do {
    lim -= (MSize)gc_onestep(L);
    if (g->gc.state == GCSpause) {
      g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
      g->vmstate = ostate;
      return 1;  /* Finished a GC cycle. */
    }
  } while ((int32_t)lim > 0);
  if (g->gc.debt < GCSTEPSIZE) {
    g->gc.threshold = g->gc.total + GCSTEPSIZE;
    g->vmstate = ostate;
    return -1;
  } else {
    g->gc.debt -= GCSTEPSIZE;
    g->gc.threshold = g->gc.total;
    g->vmstate = ostate;
    return 0;
  }
}